

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O1

uint64_t read_hex(char **ptr)

{
  char *pcVar1;
  uint uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  
  pcVar1 = *ptr;
  iVar4 = (int)*pcVar1;
  uVar5 = (ulong)(iVar4 - 0x37);
  if (5 < iVar4 - 0x41U) {
    uVar5 = 0xffffffff;
  }
  if (iVar4 - 0x30U < 10) {
    uVar5 = (ulong)(iVar4 - 0x30U);
  }
  uVar3 = 0;
  pcVar6 = pcVar1;
  while( true ) {
    if ((int)uVar5 < 0) {
      if (pcVar6 != pcVar1) {
        *ptr = pcVar6 + -1;
        return uVar3;
      }
      __assert_fail("p != *ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x857,"uint64_t read_hex(const char **)");
    }
    if (uVar3 >> 0x3c != 0) break;
    uVar3 = uVar3 * 0x10 + uVar5;
    iVar4 = (int)pcVar6[1];
    pcVar6 = pcVar6 + 1;
    uVar2 = iVar4 - 0x37;
    if (5 < iVar4 - 0x41U) {
      uVar2 = 0xffffffff;
    }
    if (iVar4 - 0x30U < 10) {
      uVar2 = iVar4 - 0x30U;
    }
    uVar5 = (ulong)uVar2;
  }
  __assert_fail("(res >> 60) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x854,"uint64_t read_hex(const char **)");
}

Assistant:

static uint64_t read_hex (const char **ptr) {
  int v;
  const char *p;
  uint64_t res = 0;

  for (p = *ptr; (v = hex_value (*p)) >= 0; p++) {
    gen_assert ((res >> 60) == 0);
    res = res * 16 + v;
  }
  gen_assert (p != *ptr);
  *ptr = p - 1;
  return res;
}